

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::CoverageMaskInvertCase::drawPattern
          (CoverageMaskInvertCase *this,bool invertSampleCoverage)

{
  GLenum err;
  int i;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float __x;
  float fVar5;
  Vec3 local_64;
  Vec3 local_58;
  Vec4 local_4c;
  Vec3 local_3c;
  
  iVar1 = 0;
  do {
    fVar2 = (float)iVar1;
    glwSampleCoverage(fVar2 / 24.0,invertSampleCoverage);
    err = glwGetError();
    glu::checkError(err,
                    "glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                    ,0x614);
    fVar5 = (fVar2 * 6.2831855) / 25.0;
    __x = ((fVar2 + 0.5) * 6.2831855) / 25.0;
    fVar3 = cosf(fVar5);
    fVar5 = sinf(fVar5);
    fVar4 = cosf(__x);
    local_64.m_data[1] = sinf(__x);
    local_64.m_data[1] = local_64.m_data[1] * 0.95;
    fVar2 = fVar2 / 25.0;
    local_4c.m_data[0] = fVar2 * 0.6 + 0.4;
    local_4c.m_data[1] = fVar2 * 0.3 + 0.5;
    local_4c.m_data[2] = 0.6 - fVar2 * 0.5;
    local_4c.m_data[3] = 0.7 - fVar2 * 0.7;
    local_3c.m_data[0] = 0.0;
    local_3c.m_data[1] = 0.0;
    local_3c.m_data[2] = 0.0;
    local_58.m_data[2] = 0.0;
    local_64.m_data[2] = 0.0;
    local_64.m_data[0] = fVar4 * 0.95;
    local_58.m_data[0] = fVar3 * 0.95;
    local_58.m_data[1] = fVar5 * 0.95;
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,&local_3c,&local_58,&local_64,&local_4c,&local_4c,
               &local_4c);
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x19);
  return;
}

Assistant:

void CoverageMaskInvertCase::drawPattern (bool invertSampleCoverage) const
{
	const int numTriangles = 25;
	for (int i = 0; i < numTriangles; i++)
	{
		GLU_CHECK_CALL(glSampleCoverage((float)i / (float)(numTriangles-1), invertSampleCoverage ? GL_TRUE : GL_FALSE));

		float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
		float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

		renderTriangle(Vec2(0.0f, 0.0f),
					   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
					   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
					   Vec4(0.4f + (float)i/(float)numTriangles*0.6f,
							0.5f + (float)i/(float)numTriangles*0.3f,
							0.6f - (float)i/(float)numTriangles*0.5f,
							0.7f - (float)i/(float)numTriangles*0.7f));
	}
}